

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal.cpp
# Opt level: O2

Int128 * __thiscall
clickhouse::ColumnDecimal::At(Int128 *__return_storage_ptr__,ColumnDecimal *this,size_t i)

{
  Code CVar1;
  int *piVar2;
  long *plVar3;
  int128 *piVar4;
  Int128 *pIVar5;
  __shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             (__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)((long)&__return_storage_ptr__[2].v_ + 8) + 0x18));
  CVar1 = Type::GetCode(local_30._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  if (CVar1 == Int32) {
    Column::As<clickhouse::ColumnVector<int>>((Column *)&local_30);
    piVar2 = ColumnVector<int>::At((ColumnVector<int> *)local_30._M_ptr,(size_t)this);
    pIVar5 = (Int128 *)(long)*piVar2;
  }
  else {
    std::__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,
               (__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&__return_storage_ptr__[2].v_ + 8) + 0x18));
    CVar1 = Type::GetCode(local_30._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    if (CVar1 == Int64) {
      Column::As<clickhouse::ColumnVector<long>>((Column *)&local_30);
      plVar3 = ColumnVector<long>::At((ColumnVector<long> *)local_30._M_ptr,(size_t)this);
      pIVar5 = (Int128 *)*plVar3;
    }
    else {
      Column::As<clickhouse::ColumnVector<absl::int128>>((Column *)&local_30);
      piVar4 = ColumnVector<absl::int128>::At
                         ((ColumnVector<absl::int128> *)local_30._M_ptr,(size_t)this);
      pIVar5 = *(Int128 **)&piVar4->v_;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return pIVar5;
}

Assistant:

Int128 ColumnDecimal::At(size_t i) const {
    if (data_->Type()->GetCode() == Type::Int32) {
        return static_cast<Int128>(data_->As<ColumnInt32>()->At(i));
    } else if (data_->Type()->GetCode() == Type::Int64) {
        return static_cast<Int128>(data_->As<ColumnInt64>()->At(i));
    } else {
        return data_->As<ColumnInt128>()->At(i);
    }
}